

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O2

MeasureVector __thiscall
testExtendedKalmanFilterZeroInput()::KalmanFunctor::measureDynamics(Eigen::
Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
          (void *this,StateVector *x,InputVector *u,TimeIndex k)

{
  Index extraout_RDX;
  CoeffReturnType CVar1;
  MeasureVector MVar2;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_120;
  InputVector *local_110;
  double local_108;
  Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_100;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_78;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)((long)this + 8) = 0;
  local_120 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(x + 6),
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u);
  local_110 = u;
  local_100 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>> *)
                         &local_110,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u);
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_0>
          ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_0>
                   *)&local_100,0);
  local_108 = cos(CVar1 * 10.0);
  Eigen::operator*(&local_f0,&local_108,
                   (StorageBaseType *)
                   &x[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
  ::operator+(&local_c0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
               *)&local_120,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_f0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator+(&local_78,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_c0,
              (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              &x[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_78);
  MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (MeasureVector)
         MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual ekf::MeasureVector measureDynamics(const ekf::StateVector & x,
                                               const ekf::InputVector & u,
                                               stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::MeasureVector yk;
      yk = c_ * x + cos(10 * (x.transpose() * x)[0]) * m_ + n_;
      return yk;
    }